

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O2

string * __thiscall
cmdline::parser::option_with_value<bool>::full_description
          (string *__return_storage_ptr__,option_with_value<bool> *this,string *description)

{
  bool bVar1;
  allocator aaStack_f8 [7];
  undefined1 in_stack_ffffffffffffff0f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_78,description," (");
  detail::readable_typename<bool>();
  std::operator+(&local_58,&local_78,&local_98);
  bVar1 = this->need;
  if (bVar1 == true) {
    std::__cxx11::string::string((string *)&local_d8,"",aaStack_f8);
  }
  else {
    detail::default_value<bool>((bool)in_stack_ffffffffffffff0f);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)aaStack_f8,
                   " [=",&local_b8);
    std::operator+(&local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)aaStack_f8,
                   "]");
  }
  std::operator+(&local_38,&local_58,&local_d8);
  std::operator+(__return_storage_ptr__,&local_38,")");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_d8);
  if (bVar1 == false) {
    std::__cxx11::string::~string((string *)aaStack_f8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  return __return_storage_ptr__;
}

Assistant:

std::string full_description(const std::string &description)
			{
				return description + " (" + detail::readable_typename<T>() + (need ? "" : " [=" + detail::default_value<T>(def) + "]") + ")";
			}